

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(long lhs,SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs
         )

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short in_SI;
  long in_RDI;
  long ret;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  undefined6 in_stack_ffffffffffffffd8;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_12;
  long local_10;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_4;
  unsigned_short local_2;
  
  local_10 = in_RDI;
  local_4.m_int = in_SI;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_12);
  bVar1 = DivisionCornerCaseHelper<unsigned_short,_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1(local_10,local_4,&local_12);
  if (bVar1) {
    local_2 = local_12.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<unsigned_short,_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
            ::DivisionCornerCase2(local_10,local_4,&local_12);
    if (bVar1) {
      local_2 = local_12.m_int;
    }
    else {
      this = (SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)0x0;
      uVar2 = SafeInt::operator_cast_to_unsigned_short
                        ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)0x0);
      DivisionHelper<long,_unsigned_short,_4>::
      DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
                ((long *)this,(unsigned_short *)CONCAT26(uVar2,in_stack_ffffffffffffffd8),
                 (long *)0x16fb47);
      SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long>
                (this,(long *)CONCAT26(uVar2,in_stack_ffffffffffffffd8));
    }
  }
  return (SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_2;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}